

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FunctionDefinition.cpp
# Opt level: O3

string * __thiscall
ninx::parser::element::FunctionDefinition::dump_abi_cxx11_
          (string *__return_storage_ptr__,FunctionDefinition *this,int level)

{
  pointer puVar1;
  FunctionArgument *pFVar2;
  Block *pBVar3;
  string *psVar4;
  long lVar5;
  long *plVar6;
  ostream *poVar7;
  long *plVar8;
  pointer puVar9;
  stringstream s;
  long *local_210;
  long local_208;
  long local_200;
  long lStack_1f8;
  FunctionDefinition *local_1f0;
  long *local_1e8 [2];
  long local_1d8 [2];
  string *local_1c8;
  long local_1c0;
  stringstream local_1b8 [16];
  ostream local_1a8 [112];
  ios_base local_138 [264];
  
  local_1f0 = this;
  std::__cxx11::stringstream::stringstream(local_1b8);
  local_1e8[0] = local_1d8;
  std::__cxx11::string::_M_construct((ulong)local_1e8,(char)level);
  plVar6 = (long *)std::__cxx11::string::append((char *)local_1e8);
  plVar8 = plVar6 + 2;
  if ((long *)*plVar6 == plVar8) {
    local_200 = *plVar8;
    lStack_1f8 = plVar6[3];
    local_210 = &local_200;
  }
  else {
    local_200 = *plVar8;
    local_210 = (long *)*plVar6;
  }
  local_208 = plVar6[1];
  *plVar6 = (long)plVar8;
  plVar6[1] = 0;
  *(undefined1 *)(plVar6 + 2) = 0;
  poVar7 = std::__ostream_insert<char,std::char_traits<char>>(local_1a8,(char *)local_210,local_208)
  ;
  poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar7,(local_1f0->name)._M_dataplus._M_p,(local_1f0->name)._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar7," {",2);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar7 + -0x18) + (char)poVar7);
  std::ostream::put((char)poVar7);
  std::ostream::flush();
  local_1c0 = (long)level;
  if (local_210 != &local_200) {
    operator_delete(local_210,local_200 + 1);
  }
  local_1c8 = __return_storage_ptr__;
  if (local_1e8[0] != local_1d8) {
    operator_delete(local_1e8[0],local_1d8[0] + 1);
  }
  puVar9 = (local_1f0->arguments).
           super__Vector_base<std::unique_ptr<ninx::parser::element::FunctionArgument,_std::default_delete<ninx::parser::element::FunctionArgument>_>,_std::allocator<std::unique_ptr<ninx::parser::element::FunctionArgument,_std::default_delete<ninx::parser::element::FunctionArgument>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  puVar1 = (local_1f0->arguments).
           super__Vector_base<std::unique_ptr<ninx::parser::element::FunctionArgument,_std::default_delete<ninx::parser::element::FunctionArgument>_>,_std::allocator<std::unique_ptr<ninx::parser::element::FunctionArgument,_std::default_delete<ninx::parser::element::FunctionArgument>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (puVar9 != puVar1) {
    do {
      pFVar2 = (puVar9->_M_t).
               super___uniq_ptr_impl<ninx::parser::element::FunctionArgument,_std::default_delete<ninx::parser::element::FunctionArgument>_>
               ._M_t.
               super__Tuple_impl<0UL,_ninx::parser::element::FunctionArgument_*,_std::default_delete<ninx::parser::element::FunctionArgument>_>
               .super__Head_base<0UL,_ninx::parser::element::FunctionArgument_*,_false>._M_head_impl
      ;
      (**(code **)((long)(pFVar2->super_ASTElement)._vptr_ASTElement + 0x18))
                (&local_210,pFVar2,level + 1);
      poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                         (local_1a8,(char *)local_210,local_208);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar7 + -0x18) + (char)poVar7);
      std::ostream::put((char)poVar7);
      std::ostream::flush();
      if (local_210 != &local_200) {
        operator_delete(local_210,local_200 + 1);
      }
      puVar9 = puVar9 + 1;
    } while (puVar9 != puVar1);
  }
  pBVar3 = (local_1f0->body)._M_t.
           super___uniq_ptr_impl<ninx::parser::element::Block,_std::default_delete<ninx::parser::element::Block>_>
           ._M_t.
           super__Tuple_impl<0UL,_ninx::parser::element::Block_*,_std::default_delete<ninx::parser::element::Block>_>
           .super__Head_base<0UL,_ninx::parser::element::Block_*,_false>._M_head_impl;
  (**(code **)(*(long *)&(pBVar3->super_Expression).super_Statement + 0x18))
            (&local_210,pBVar3,level + 1);
  poVar7 = std::__ostream_insert<char,std::char_traits<char>>(local_1a8,(char *)local_210,local_208)
  ;
  lVar5 = local_1c0;
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar7 + -0x18) + (char)poVar7);
  std::ostream::put((char)poVar7);
  std::ostream::flush();
  if (local_210 != &local_200) {
    operator_delete(local_210,local_200 + 1);
  }
  local_1e8[0] = local_1d8;
  std::__cxx11::string::_M_construct((ulong)local_1e8,(char)lVar5);
  plVar6 = (long *)std::__cxx11::string::append((char *)local_1e8);
  plVar8 = plVar6 + 2;
  if ((long *)*plVar6 == plVar8) {
    local_200 = *plVar8;
    lStack_1f8 = plVar6[3];
    local_210 = &local_200;
  }
  else {
    local_200 = *plVar8;
    local_210 = (long *)*plVar6;
  }
  local_208 = plVar6[1];
  *plVar6 = (long)plVar8;
  plVar6[1] = 0;
  *(undefined1 *)(plVar6 + 2) = 0;
  poVar7 = std::__ostream_insert<char,std::char_traits<char>>(local_1a8,(char *)local_210,local_208)
  ;
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar7 + -0x18) + (char)poVar7);
  std::ostream::put((char)poVar7);
  std::ostream::flush();
  if (local_210 != &local_200) {
    operator_delete(local_210,local_200 + 1);
  }
  if (local_1e8[0] != local_1d8) {
    operator_delete(local_1e8[0],local_1d8[0] + 1);
  }
  psVar4 = local_1c8;
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream(local_1b8);
  std::ios_base::~ios_base(local_138);
  return psVar4;
}

Assistant:

std::string ninx::parser::element::FunctionDefinition::dump(int level) const {
    std::stringstream s;

    s << std::string(level, '\t') + "FunctionDefinition " << this->name << " {" << std::endl;
    for (auto& argument : arguments) {
        s << argument->dump(level+1) << std::endl;
    }
    s << body->dump(level+1) << std::endl;
    s << std::string(level, '\t') + "}" << std::endl;

    return s.str();
}